

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

BoundLimitNode *
duckdb::BoundLimitNode::Deserialize
          (BoundLimitNode *__return_storage_ptr__,Deserializer *deserializer)

{
  LimitNodeType type;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var3;
  pointer *__ptr;
  double extraout_XMM0_Qa;
  string str;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  double local_50;
  undefined1 local_48 [32];
  idx_t constant_integer;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    type = EnumUtil::FromString<duckdb::LimitNodeType>((char *)local_48._0_8_);
    if ((Expression *)local_48._0_8_ != (Expression *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    type = (LimitNodeType)iVar2;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"constant_integer");
  pp_Var3 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    constant_integer = 0;
  }
  else {
    iVar2 = (*pp_Var3[0x15])(deserializer);
    constant_integer = CONCAT44(extraout_var,iVar2);
    pp_Var3 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar1 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"constant_percentage");
  (*deserializer->_vptr_Deserializer[0x19])(deserializer);
  local_50 = extraout_XMM0_Qa;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"expression");
  local_58._M_head_impl = (Expression *)0x0;
  if ((char)iVar2 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      local_58._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)local_48,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      local_58._M_head_impl = (Expression *)local_48._0_8_;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  BoundLimitNode(__return_storage_ptr__,type,constant_integer,local_50,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_58);
  if (local_58._M_head_impl != (Expression *)0x0) {
    (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundLimitNode BoundLimitNode::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<LimitNodeType>(100, "type");
	auto constant_integer = deserializer.ReadPropertyWithDefault<idx_t>(101, "constant_integer");
	auto constant_percentage = deserializer.ReadProperty<double>(102, "constant_percentage");
	auto expression = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(103, "expression");
	BoundLimitNode result(type, constant_integer, constant_percentage, std::move(expression));
	return result;
}